

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O2

void __thiscall ABasicArmorBonus::Serialize(ABasicArmorBonus *this,FSerializer *arc)

{
  AActor *pAVar1;
  FSerializer *pFVar2;
  
  AInventory::Serialize((AInventory *)this,arc);
  pAVar1 = AActor::GetDefault((AActor *)this);
  pFVar2 = FSerializer::operator()(arc,"savepercent",&this->SavePercent,(double *)&pAVar1[1].sprev);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"saveamount",&this->SaveAmount,(int *)((long)&pAVar1[1].__Pos.Y + 4));
  pFVar2 = FSerializer::operator()
                     (pFVar2,"maxsaveamount",&this->MaxSaveAmount,(int *)&pAVar1[1].__Pos);
  pFVar2 = FSerializer::operator()(pFVar2,"bonuscount",&this->BonusCount,(int *)&pAVar1[1].__Pos.Z);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"bonusmax",&this->BonusMax,(int *)((long)&pAVar1[1].__Pos.Z + 4));
  pFVar2 = FSerializer::operator()
                     (pFVar2,"maxabsorb",&this->MaxAbsorb,(int *)((long)&pAVar1[1].__Pos.X + 4));
  FSerializer::operator()(pFVar2,"maxfullabsorb",&this->MaxFullAbsorb,(int *)&pAVar1[1].__Pos.Y);
  return;
}

Assistant:

void ABasicArmorBonus::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	auto def = (ABasicArmorBonus *)GetDefault();
	arc("savepercent", SavePercent, def->SavePercent)
		("saveamount", SaveAmount, def->SaveAmount)
		("maxsaveamount", MaxSaveAmount, def->MaxSaveAmount)
		("bonuscount", BonusCount, def->BonusCount)
		("bonusmax", BonusMax, def->BonusMax)
		("maxabsorb", MaxAbsorb, def->MaxAbsorb)
		("maxfullabsorb", MaxFullAbsorb, def->MaxFullAbsorb);
}